

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexInternalShape.cpp
# Opt level: O1

void __thiscall
cbtConvexInternalShape::getAabbSlow
          (cbtConvexInternalShape *this,cbtTransform *trans,cbtVector3 *minAabb,cbtVector3 *maxAabb)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int i;
  long lVar3;
  float in_XMM0_Da;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  uint local_68;
  float fStack_64;
  undefined8 uStack_60;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  (*(this->super_cbtConvexShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])();
  lVar3 = 0;
  do {
    _local_68 = 0;
    uStack_60 = 0;
    (&local_68)[lVar3] = 0x3f800000;
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fStack_64 * (trans->m_basis).m_el[1].m_floats[0])),
                             ZEXT416(local_68),ZEXT416((uint)(trans->m_basis).m_el[0].m_floats[0]));
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)uStack_60),
                             ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[0]));
    auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fStack_64 * (trans->m_basis).m_el[1].m_floats[1])),
                             ZEXT416(local_68),ZEXT416((uint)(trans->m_basis).m_el[0].m_floats[1]));
    auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)uStack_60),
                             ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[1]));
    auVar4 = vinsertps_avx(auVar4,auVar1,0x10);
    auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fStack_64 * (trans->m_basis).m_el[1].m_floats[2])),
                             ZEXT416(local_68),ZEXT416((uint)(trans->m_basis).m_el[0].m_floats[2]));
    auVar5 = vfmadd231ss_fma(auVar1,ZEXT416((uint)uStack_60),
                             ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[2]));
    auVar4 = vinsertps_avx(auVar4,auVar5,0x28);
    local_50 = auVar4;
    (*(this->super_cbtConvexShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x10])
              (this,local_50);
    auVar1 = vmovshdup_avx(auVar4);
    fVar6 = auVar1._0_4_;
    auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (trans->m_basis).m_el[0].m_floats[1])),auVar4,
                             ZEXT416((uint)(trans->m_basis).m_el[0].m_floats[0]));
    auVar1 = vfmadd231ss_fma(auVar1,auVar5,ZEXT416((uint)(trans->m_basis).m_el[0].m_floats[2]));
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (trans->m_basis).m_el[1].m_floats[1])),auVar4,
                             ZEXT416((uint)(trans->m_basis).m_el[1].m_floats[0]));
    auVar2 = vfmadd231ss_fma(auVar2,auVar5,ZEXT416((uint)(trans->m_basis).m_el[1].m_floats[2]));
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (trans->m_basis).m_el[2].m_floats[1])),auVar4,
                             ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[0]));
    auVar5 = vfmadd231ss_fma(auVar4,auVar5,ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[2]));
    auVar4 = vinsertps_avx(ZEXT416((uint)(auVar1._0_4_ + (trans->m_origin).m_floats[0])),
                           ZEXT416((uint)(auVar2._0_4_ + (trans->m_origin).m_floats[1])),0x10);
    local_50 = vinsertps_avx(auVar4,ZEXT416((uint)(auVar5._0_4_ + (trans->m_origin).m_floats[2])),
                             0x28);
    maxAabb->m_floats[lVar3] = in_XMM0_Da + *(float *)(local_50 + lVar3 * 4);
    (&local_68)[lVar3] = 0xbf800000;
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fStack_64 * (trans->m_basis).m_el[1].m_floats[0])),
                             ZEXT416(local_68),ZEXT416((uint)(trans->m_basis).m_el[0].m_floats[0]));
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)uStack_60),
                             ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[0]));
    auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fStack_64 * (trans->m_basis).m_el[1].m_floats[1])),
                             ZEXT416(local_68),ZEXT416((uint)(trans->m_basis).m_el[0].m_floats[1]));
    auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)uStack_60),
                             ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[1]));
    auVar4 = vinsertps_avx(auVar4,auVar1,0x10);
    auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fStack_64 * (trans->m_basis).m_el[1].m_floats[2])),
                             ZEXT416(local_68),ZEXT416((uint)(trans->m_basis).m_el[0].m_floats[2]));
    auVar5 = vfmadd231ss_fma(auVar1,ZEXT416((uint)uStack_60),
                             ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[2]));
    auVar4 = vinsertps_avx(auVar4,auVar5,0x28);
    local_40 = auVar4;
    (*(this->super_cbtConvexShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x10])
              (this,local_40);
    auVar1 = vmovshdup_avx(auVar4);
    fVar6 = auVar1._0_4_;
    auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (trans->m_basis).m_el[0].m_floats[1])),auVar4,
                             ZEXT416((uint)(trans->m_basis).m_el[0].m_floats[0]));
    auVar1 = vfmadd231ss_fma(auVar1,auVar5,ZEXT416((uint)(trans->m_basis).m_el[0].m_floats[2]));
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (trans->m_basis).m_el[1].m_floats[1])),auVar4,
                             ZEXT416((uint)(trans->m_basis).m_el[1].m_floats[0]));
    auVar2 = vfmadd231ss_fma(auVar2,auVar5,ZEXT416((uint)(trans->m_basis).m_el[1].m_floats[2]));
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (trans->m_basis).m_el[2].m_floats[1])),auVar4,
                             ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[0]));
    auVar5 = vfmadd231ss_fma(auVar4,auVar5,ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[2]));
    auVar4 = vinsertps_avx(ZEXT416((uint)(auVar1._0_4_ + (trans->m_origin).m_floats[0])),
                           ZEXT416((uint)(auVar2._0_4_ + (trans->m_origin).m_floats[1])),0x10);
    local_50 = vinsertps_avx(auVar4,ZEXT416((uint)(auVar5._0_4_ + (trans->m_origin).m_floats[2])),
                             0x28);
    minAabb->m_floats[lVar3] = *(float *)(local_50 + lVar3 * 4) - in_XMM0_Da;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  return;
}

Assistant:

void cbtConvexInternalShape::getAabbSlow(const cbtTransform& trans, cbtVector3& minAabb, cbtVector3& maxAabb) const
{
#ifndef __SPU__
	//use localGetSupportingVertexWithoutMargin?
	cbtScalar margin = getMargin();
	for (int i = 0; i < 3; i++)
	{
		cbtVector3 vec(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));
		vec[i] = cbtScalar(1.);

		cbtVector3 sv = localGetSupportingVertex(vec * trans.getBasis());

		cbtVector3 tmp = trans(sv);
		maxAabb[i] = tmp[i] + margin;
		vec[i] = cbtScalar(-1.);
		tmp = trans(localGetSupportingVertex(vec * trans.getBasis()));
		minAabb[i] = tmp[i] - margin;
	}
#endif
}